

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O0

int cbs_str_equal(CBS *cbs,char *str)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t *s1;
  undefined1 local_19;
  char *str_local;
  CBS *cbs_local;
  
  sVar2 = CBS_len(cbs);
  sVar3 = strlen(str);
  local_19 = false;
  if (sVar2 == sVar3) {
    s1 = CBS_data(cbs);
    sVar3 = strlen(str);
    iVar1 = OPENSSL_memcmp(s1,str,sVar3);
    local_19 = iVar1 == 0;
  }
  return (int)local_19;
}

Assistant:

static int cbs_str_equal(const CBS *cbs, const char *str) {
  return CBS_len(cbs) == strlen(str) &&
         OPENSSL_memcmp(CBS_data(cbs), str, strlen(str)) == 0;
}